

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbolNoPlaceholder
          (DescriptorBuilder *this,string *name,string *relative_to,ResolveMode resolve_mode)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  Symbol SVar7;
  undefined1 local_f8 [8];
  Symbol result;
  size_type old_size;
  size_type dot_pos;
  string scope_to_try;
  string local_90 [8];
  string first_part_of_name;
  size_type name_dot_pos;
  string local_58;
  ResolveMode local_34;
  string *psStack_30;
  ResolveMode resolve_mode_local;
  string *relative_to_local;
  string *name_local;
  DescriptorBuilder *this_local;
  anon_union_8_7_bfa3a334_for_Symbol_2 local_10;
  
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  local_34 = resolve_mode;
  psStack_30 = relative_to;
  relative_to_local = name;
  name_local = (string *)this;
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)relative_to_local);
    if (*pcVar4 == '.') {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)relative_to_local);
      SVar7 = FindSymbol(this,&local_58);
      local_10 = SVar7.field_1;
      this_local = (DescriptorBuilder *)CONCAT44(this_local._4_4_,SVar7.type);
      std::__cxx11::string::~string((string *)&local_58);
      goto LAB_002c8456;
    }
  }
  first_part_of_name.field_2._8_8_ =
       std::__cxx11::string::find_first_of((char)relative_to_local,0x2e);
  std::__cxx11::string::string(local_90);
  if (first_part_of_name.field_2._8_8_ == -1) {
    std::__cxx11::string::operator=(local_90,(string *)relative_to_local);
  }
  else {
    std::__cxx11::string::substr((ulong)((long)&scope_to_try.field_2 + 8),(ulong)relative_to_local);
    std::__cxx11::string::operator=(local_90,(string *)(scope_to_try.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(scope_to_try.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string((string *)&dot_pos,(string *)psStack_30);
  while( true ) {
    uVar5 = std::__cxx11::string::find_last_of((char)&dot_pos,0x2e);
    if (uVar5 == 0xffffffffffffffff) break;
    std::__cxx11::string::erase((ulong)&dot_pos,uVar5);
    result.field_1.descriptor = (Descriptor *)std::__cxx11::string::size();
    std::__cxx11::string::append((ulong)&dot_pos,'\x01');
    std::__cxx11::string::append((string *)&dot_pos);
    SVar7 = FindSymbol(this,(string *)&dot_pos);
    result._0_8_ = SVar7.field_1;
    local_f8._0_4_ = SVar7.type;
    bVar2 = anon_unknown_1::Symbol::IsNull((Symbol *)local_f8);
    if (!bVar2) {
      uVar5 = std::__cxx11::string::size();
      uVar6 = std::__cxx11::string::size();
      if (uVar5 < uVar6) {
        bVar2 = anon_unknown_1::Symbol::IsAggregate((Symbol *)local_f8);
        psVar1 = relative_to_local;
        if (bVar2) {
          uVar5 = std::__cxx11::string::size();
          std::__cxx11::string::size();
          std::__cxx11::string::size();
          std::__cxx11::string::append((string *)&dot_pos,(ulong)psVar1,uVar5);
          SVar7 = FindSymbol(this,(string *)&dot_pos);
          local_10 = SVar7.field_1;
          this_local = (DescriptorBuilder *)CONCAT44(this_local._4_4_,SVar7.type);
          goto LAB_002c842e;
        }
      }
      else if ((local_34 != LOOKUP_TYPES) ||
              (bVar2 = anon_unknown_1::Symbol::IsType((Symbol *)local_f8), bVar2)) {
        this_local = (DescriptorBuilder *)CONCAT44(local_f8._4_4_,local_f8._0_4_);
        local_10 = (anon_union_8_7_bfa3a334_for_Symbol_2)result._0_8_;
        goto LAB_002c842e;
      }
    }
    std::__cxx11::string::erase((ulong)&dot_pos,(ulong)result.field_1);
  }
  SVar7 = FindSymbol(this,relative_to_local);
  local_10 = SVar7.field_1;
  this_local = (DescriptorBuilder *)CONCAT44(this_local._4_4_,SVar7.type);
LAB_002c842e:
  std::__cxx11::string::~string((string *)&dot_pos);
  std::__cxx11::string::~string(local_90);
LAB_002c8456:
  SVar7._0_8_ = (ulong)this_local & 0xffffffff;
  SVar7.field_1.descriptor = local_10.descriptor;
  return SVar7;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbolNoPlaceholder(
    const string& name, const string& relative_to, ResolveMode resolve_mode) {
  possible_undeclared_dependency_ = NULL;

  if (name.size() > 0 && name[0] == '.') {
    // Fully-qualified name.
    return FindSymbol(name.substr(1));
  }

  // If name is something like "Foo.Bar.baz", and symbols named "Foo" are
  // defined in multiple parent scopes, we only want to find "Bar.baz" in the
  // innermost one.  E.g., the following should produce an error:
  //   message Bar { message Baz {} }
  //   message Foo {
  //     message Bar {
  //     }
  //     optional Bar.Baz baz = 1;
  //   }
  // So, we look for just "Foo" first, then look for "Bar.baz" within it if
  // found.
  string::size_type name_dot_pos = name.find_first_of('.');
  string first_part_of_name;
  if (name_dot_pos == string::npos) {
    first_part_of_name = name;
  } else {
    first_part_of_name = name.substr(0, name_dot_pos);
  }

  string scope_to_try(relative_to);

  while (true) {
    // Chop off the last component of the scope.
    string::size_type dot_pos = scope_to_try.find_last_of('.');
    if (dot_pos == string::npos) {
      return FindSymbol(name);
    } else {
      scope_to_try.erase(dot_pos);
    }

    // Append ".first_part_of_name" and try to find.
    string::size_type old_size = scope_to_try.size();
    scope_to_try.append(1, '.');
    scope_to_try.append(first_part_of_name);
    Symbol result = FindSymbol(scope_to_try);
    if (!result.IsNull()) {
      if (first_part_of_name.size() < name.size()) {
        // name is a compound symbol, of which we only found the first part.
        // Now try to look up the rest of it.
        if (result.IsAggregate()) {
          scope_to_try.append(name, first_part_of_name.size(),
                              name.size() - first_part_of_name.size());
          return FindSymbol(scope_to_try);
        } else {
          // We found a symbol but it's not an aggregate.  Continue the loop.
        }
      } else {
        if (resolve_mode == LOOKUP_TYPES && !result.IsType()) {
          // We found a symbol but it's not a type.  Continue the loop.
        } else {
          return result;
        }
      }
    }

    // Not found.  Remove the name so we can try again.
    scope_to_try.erase(old_size);
  }
}